

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgridlayout.cpp
# Opt level: O3

void initEmptyMultiBox(QList<QLayoutStruct> *chain,int start,int end)

{
  pointer pQVar1;
  int iVar2;
  int i;
  ulong uVar3;
  
  if (start <= end) {
    uVar3 = (long)start << 5 | 0x15;
    iVar2 = (end - start) + 1;
    do {
      pQVar1 = QList<QLayoutStruct>::data(chain);
      if ((*(char *)((long)&pQVar1->stretch + uVar3) == '\x01') &&
         (*(int *)((long)pQVar1 + (uVar3 - 0xd)) == 0)) {
        *(undefined4 *)((long)pQVar1 + (uVar3 - 0xd)) = 0xffffff;
      }
      *(undefined1 *)((long)&pQVar1->stretch + uVar3) = 0;
      uVar3 = uVar3 + 0x20;
      iVar2 = iVar2 + -1;
    } while (iVar2 != 0);
  }
  return;
}

Assistant:

static void initEmptyMultiBox(QList<QLayoutStruct> &chain, int start, int end)
{
    for (int i = start; i <= end; i++) {
        QLayoutStruct *data = &chain[i];
        if (data->empty && data->maximumSize == 0) // truly empty box
            data->maximumSize = QWIDGETSIZE_MAX;
        data->empty = false;
    }
}